

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_kwp.c
# Opt level: O2

err_t beltKWPWrap(octet *dest,octet *src,size_t count,octet *header,octet *key,size_t len)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  eVar2 = 0x6d;
  if ((((0xf < count) && (len < 0x21)) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) &&
     (bVar1 = memIsValid(src,count), bVar1 != 0)) {
    if (header != (octet *)0x0) {
      bVar1 = memIsValid(header,0x10);
      if (bVar1 == 0) {
        return 0x6d;
      }
      bVar1 = memIsDisjoint2(src,count,header,0x10);
      if (bVar1 == 0) {
        return 0x6d;
      }
    }
    bVar1 = memIsValid(key,len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(dest,count + 0x10);
      if (bVar1 != 0) {
        size = beltWBL_keep();
        state = blobCreate(size);
        if (state == (blob_t)0x0) {
          eVar2 = 0x6e;
        }
        else {
          beltWBLStart(state,key,len);
          memMove(dest,src,count);
          if (header == (octet *)0x0) {
            memSet(dest + count,'\0',0x10);
          }
          else {
            memJoin(dest,src,count,header,0x10);
          }
          beltWBLStepE(dest,count + 0x10,state);
          blobClose(state);
          eVar2 = 0;
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltKWPWrap(octet dest[], const octet src[], size_t count,
	const octet header[16], const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (count < 16 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsNullOrValid(header, 16) ||
		header && !memIsDisjoint2(src, count, header, 16) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, count + 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltKWP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// установить защиту
	beltKWPStart(state, key, len);
	memMove(dest, src, count);
	if (header)
		memJoin(dest, src, count, header, 16);
	else
		memSetZero(dest + count, 16);
	beltKWPStepE(dest, count + 16, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}